

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O3

bool __thiscall MainWindow::maybeSave(MainWindow *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  QArrayData *local_80 [3];
  QString local_68;
  QArrayData *local_50 [3];
  QArrayData *local_38 [3];
  
  bVar1 = Module::isModified(this->mModule);
  bVar3 = true;
  if (bVar1) {
    QMetaObject::tr((char *)local_50,(char *)&staticMetaObject,0x1b4e7c);
    QMetaObject::tr((char *)local_80,(char *)&staticMetaObject,0x1b5872);
    ModuleFile::name(&this->mModuleFile);
    QString::arg(&local_68,(int)local_80,(QChar)(char16_t)local_38);
    iVar2 = QMessageBox::warning(this,local_50,&local_68,0xc00800,0);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,8);
      }
    }
    if (local_80[0] != (QArrayData *)0x0) {
      LOCK();
      (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_80[0],2,8);
      }
    }
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,8);
      }
    }
    if (iVar2 == 0x800) {
      bVar1 = onFileSave(this);
      if (bVar1) {
        return true;
      }
    }
    else if (iVar2 != 0x400000) {
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MainWindow::maybeSave() {
    if (mModule->isModified()) {
        // prompt the user if they want to save any changes
        auto const result = QMessageBox::warning(
            this,
            tr("Trackerboy"),
            tr("Save changes to %1?").arg(mModuleFile.name()),
            QMessageBox::Save | QMessageBox::Discard | QMessageBox::Cancel
        );

        switch (result) {
            case QMessageBox::Save:
                if (!onFileSave()) {
                    // save failed, do not close document
                    return false;
                }
                break;
            case QMessageBox::Cancel:
                // user cancelled, do not close document
                return false;
            default:
                break;
        }
    }

    return true;
}